

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall deci::ast_binary_t::~ast_binary_t(ast_binary_t *this)

{
  ast_binary_t *this_local;
  
  if (this->a != (ast_item_t *)0x0) {
    (*this->a->_vptr_ast_item_t[4])();
  }
  if (this->b != (ast_item_t *)0x0) {
    (*this->b->_vptr_ast_item_t[4])();
  }
  std::__cxx11::string::~string((string *)&this->identifier);
  ast_item_t::~ast_item_t(&this->super_ast_item_t);
  return;
}

Assistant:

ast_binary_t::~ast_binary_t() {
    delete this->a;
    delete this->b;
  }